

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_function::translate
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  var_id *pvVar6;
  string *psVar7;
  statement_base *psVar8;
  size_type sVar9;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  tree_type<cs::token_base_*> *it;
  iterator __end1;
  iterator __begin1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range1;
  bool is_vargs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string name;
  tree_type<cs::token_base_*> *t;
  _Self *in_stack_fffffffffffffd28;
  compiler_type *in_stack_fffffffffffffd30;
  _Self *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 uVar10;
  iterator *in_stack_fffffffffffffd70;
  iterator *in_stack_fffffffffffffd78;
  iterator in_stack_fffffffffffffd80;
  allocator_type *in_stack_fffffffffffffd98;
  iterator in_stack_fffffffffffffda0;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffda8;
  iterator in_stack_fffffffffffffdb0;
  string local_228 [46];
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  statement_function *in_stack_fffffffffffffe20;
  context_t *in_stack_fffffffffffffe30;
  token_base *in_stack_fffffffffffffe38;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_b8;
  tree_node *local_88;
  tree_node *local_80;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_78;
  byte local_69;
  tree_node *local_50;
  tree_node *local_48;
  string local_40 [32];
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
  local_20 = token_expr::get_tree((token_expr *)*pptVar4);
  local_50 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28);
  local_48 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffd78);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
  pvVar6 = token_id::get_id((token_id *)*pptVar5);
  psVar7 = var_id::operator_cast_to_string_(pvVar6);
  std::__cxx11::string::string(local_40,(string *)psVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x568f6d);
  local_69 = 0;
  local_88 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28);
  local_80 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffd78);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
  local_78 = token_arglist::get_arglist((token_arglist *)*pptVar5);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffd28);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *)
      in_stack_fffffffffffffd28);
  while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28),
        bVar1) {
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
    ::operator*(&local_b8);
    in_stack_fffffffffffffdb0 =
         tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28)
    ;
    in_stack_fffffffffffffda8 =
         (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
          *)tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
    iVar2 = (*((token_base *)in_stack_fffffffffffffda8->_M_cur)->_vptr_token_base[2])();
    if (iVar2 == 4) {
      in_stack_fffffffffffffda0 =
           tree_type<cs::token_base_*>::root
                     ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd98 =
           (allocator_type *)tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
      pvVar6 = token_id::get_id(*(token_id **)in_stack_fffffffffffffd98);
      var_id::operator_cast_to_string_(pvVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                  (value_type *)in_stack_fffffffffffffd38);
    }
    else {
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
      iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
      if (iVar2 == 5) {
        in_stack_fffffffffffffd80 =
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd28);
        pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd70);
        token_vargs::get_id_abi_cxx11_((token_vargs *)*pptVar5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                    (value_type *)in_stack_fffffffffffffd38);
        local_69 = 1;
      }
    }
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
    ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  *)in_stack_fffffffffffffd30);
  }
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5691e4);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5691f3);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5691fb);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd28);
  std::operator+(in_stack_fffffffffffffd38,(difference_type)in_stack_fffffffffffffd30);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffd28);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x569262
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffdb0.mData,in_stack_fffffffffffffda8,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffda0.mData,in_stack_fffffffffffffd98);
  compiler_type::translate
            (in_stack_fffffffffffffd30,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffd28,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x56929a);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffd80.mData);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x5692b6
            );
  psVar8 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd30);
  std::__cxx11::string::string(local_228,local_40);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  sVar9 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5692fb);
  uVar10 = CONCAT13(sVar9 == 4,(int3)in_stack_fffffffffffffd44);
  uVar3 = (uint)local_69;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)CONCAT44(uVar10,uVar3));
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)CONCAT44(uVar10,uVar3));
  statement_function::statement_function
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07,
             (bool)in_stack_fffffffffffffe06,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_228);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd80.mData);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(uVar10,uVar3));
  std::__cxx11::string::~string(local_40);
  return psVar8;
}

Assistant:

statement_base *
	method_function::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		std::string name = static_cast<token_id *>(t.root().left().data())->get_id();
		std::vector<std::string> args;
		bool is_vargs = false;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data()->get_type() == token_types::id)
				args.push_back(static_cast<token_id *>(it.root().data())->get_id());
			else if (it.root().data()->get_type() == token_types::vargs) {
				args.push_back(static_cast<token_vargs *>(it.root().data())->get_id());
				is_vargs = true;
			}
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
#ifdef CS_DEBUGGER
		std::string decl="function "+name+"(";
		if(args.size()!=0) {
			for(auto& it:args)
				decl+=it+", ";
			decl.pop_back();
			decl[decl.size()-1]=')';
		}
		else
			decl+=")";
		if(raw.front().size() == 4)
			decl+=" override";
		return new statement_function(name, decl, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#else
		return new statement_function(name, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#endif
	}